

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall Timer::restart(Timer *this,int interval,int flags,shared_ptr<EventLoop> *l)

{
  int iVar1;
  SharedPtr loop;
  __shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2> local_68;
  function<void_(int)> local_58;
  _Bind<void_(Timer::*(Timer_*,_std::_Placeholder<1>))(int)> local_38;
  
  if ((l->super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>)._M_ptr == (element_type *)0x0)
  {
    EventLoop::eventLoop();
  }
  else {
    std::__shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,&l->super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>);
  }
  if (local_68._M_ptr != (EventLoop *)0x0) {
    if (this->timerId != 0) {
      EventLoop::unregisterTimer(local_68._M_ptr,this->timerId);
    }
    local_38._M_f = (offset_in_Timer_to_subr)timerFired;
    local_38._8_8_ = 0;
    local_38._M_bound_args.super__Tuple_impl<0UL,_Timer_*,_std::_Placeholder<1>_>.
    super__Head_base<0UL,_Timer_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_Timer_*,_std::_Placeholder<1>_>)
         (_Tuple_impl<0UL,_Timer_*,_std::_Placeholder<1>_>)this;
    std::function<void(int)>::
    function<std::_Bind<void(Timer::*(Timer*,std::_Placeholder<1>))(int)>,void>
              ((function<void(int)> *)&local_58,&local_38);
    iVar1 = EventLoop::registerTimer(local_68._M_ptr,&local_58,interval,flags);
    this->timerId = iVar1;
    std::_Function_base::~_Function_base(&local_58.super__Function_base);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  return;
}

Assistant:

void Timer::restart(int interval, int flags, const std::shared_ptr<EventLoop> &l)
{
    EventLoop::SharedPtr loop = l ? l : EventLoop::eventLoop();
    if (loop) {
        // ### this is a bit inefficient, should revisit
        if (timerId)
            loop->unregisterTimer(timerId);
        timerId = loop->registerTimer(std::bind(&Timer::timerFired, this, std::placeholders::_1),
                                      interval, flags);
    }
}